

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void mp::internal::ReadBinary<mp::internal::EndiannessConverter,TestNLHandler3>
               (TextReader<fmt::Locale> *reader,NLHeader *header,TestNLHandler3 *handler,int flags)

{
  int in_ECX;
  TestNLHandler3 *in_RDX;
  NLHeader *in_RSI;
  BinaryReader<mp::internal::EndiannessConverter> bin_reader;
  ReaderBase *base;
  BinaryReader<mp::internal::EndiannessConverter> *in_stack_ffffffffffffff70;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3> local_80;
  ReaderBase local_60;
  int local_1c;
  TestNLHandler3 *local_18;
  
  base = &local_60;
  local_1c = in_ECX;
  local_18 = in_RDX;
  BinaryReader<mp::internal::EndiannessConverter>::BinaryReader(in_stack_ffffffffffffff70,base);
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>::NLReader
            (&local_80,(BinaryReader<mp::internal::EndiannessConverter> *)base,in_RSI,local_18,
             local_1c);
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>::Read
            ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler3>
              *)in_RSI);
  BinaryReader<mp::internal::EndiannessConverter>::~BinaryReader
            ((BinaryReader<mp::internal::EndiannessConverter> *)0x2470c4);
  return;
}

Assistant:

void ReadBinary(TextReader<> &reader, const NLHeader &header,
                Handler &handler, int flags) {
  BinaryReader<InputConverter> bin_reader(reader);
  NLReader<BinaryReader<InputConverter>, Handler>(
        bin_reader, header, handler, flags).Read();
}